

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool __thiscall
el::base::RegisteredHitCounters::validateEveryN
          (RegisteredHitCounters *this,char *filename,LineNumber lineNumber,size_t n)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  bool local_61;
  bool result;
  HitCounter *local_38;
  HitCounter *counter;
  ScopedLock scopedLock;
  size_t n_local;
  LineNumber lineNumber_local;
  char *filename_local;
  RegisteredHitCounters *this_local;
  
  scopedLock._vptr_NoScopedLock = (_func_int **)n;
  lineNumber_local = (LineNumber)filename;
  filename_local = (char *)this;
  iVar1 = (*(this->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
            super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
            .super_ThreadSafe._vptr_ThreadSafe[2])();
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::NoScopedLock
            ((NoScopedLock<el::base::threading::internal::NoMutex> *)&counter,
             (NoMutex *)CONCAT44(extraout_var,iVar1));
  local_38 = utils::RegistryWithPred<el::base::HitCounter,el::base::HitCounter::Predicate>::
             get<char_const*,unsigned_long>
                       ((RegistryWithPred<el::base::HitCounter,el::base::HitCounter::Predicate> *)
                        this,(char **)&lineNumber_local,lineNumber);
  if (local_38 == (HitCounter *)0x0) {
    local_38 = (HitCounter *)operator_new(0x20);
    HitCounter::HitCounter(local_38,(char *)lineNumber_local,lineNumber);
    (*(this->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
      super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
      .super_ThreadSafe._vptr_ThreadSafe[0x10])();
  }
  HitCounter::validateHitCounts(local_38,(size_t)scopedLock._vptr_NoScopedLock);
  local_61 = false;
  if (scopedLock._vptr_NoScopedLock != (_func_int **)0x0) {
    sVar2 = HitCounter::hitCounts(local_38);
    local_61 = false;
    if (sVar2 != 0) {
      sVar2 = HitCounter::hitCounts(local_38);
      local_61 = sVar2 % (ulong)scopedLock._vptr_NoScopedLock == 0;
    }
  }
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::~NoScopedLock
            ((NoScopedLock<el::base::threading::internal::NoMutex> *)&counter);
  return local_61;
}

Assistant:

bool RegisteredHitCounters::validateEveryN(const char* filename, base::type::LineNumber lineNumber, std::size_t n) {
  base::threading::ScopedLock scopedLock(lock());
  base::HitCounter* counter = get(filename, lineNumber);
  if (counter == nullptr) {
    registerNew(counter = new base::HitCounter(filename, lineNumber));
  }
  counter->validateHitCounts(n);
  bool result = (n >= 1 && counter->hitCounts() != 0 && counter->hitCounts() % n == 0);
  return result;
}